

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void yang_free_ext_data(yang_ext_substmt *substmt)

{
  int local_14;
  int i;
  yang_ext_substmt *substmt_local;
  
  if (substmt != (yang_ext_substmt *)0x0) {
    free(substmt->ext_substmt);
    if (substmt->ext_modules != (char **)0x0) {
      for (local_14 = 0; substmt->ext_modules[local_14] != (char *)0x0; local_14 = local_14 + 1) {
        free(substmt->ext_modules[local_14]);
      }
      free(substmt->ext_modules);
    }
    free(substmt);
  }
  return;
}

Assistant:

void
yang_free_ext_data(struct yang_ext_substmt *substmt)
{
    int i;

    if (!substmt) {
        return;
    }

    free(substmt->ext_substmt);
    if (substmt->ext_modules) {
        for (i = 0; substmt->ext_modules[i]; ++i) {
            free(substmt->ext_modules[i]);
        }
        free(substmt->ext_modules);
    }
    free(substmt);
}